

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceNodeCloud.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChContactSurfaceNodeCloud::SurfaceSyncCollisionModels(ChContactSurfaceNodeCloud *this)

{
  bool bVar1;
  pointer psVar2;
  pointer psVar3;
  ulong uVar4;
  ulong uVar5;
  
  psVar2 = (this->vnodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->vnodes).
      super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar2) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      (*(psVar2[uVar4].
         super___shared_ptr<chrono::fea::ChContactNodeXYZsphere,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->collision_model->_vptr_ChCollisionModel[0x18])();
      psVar2 = (this->vnodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar1 = uVar5 < (ulong)((long)(this->vnodes).
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4);
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar1);
  }
  psVar3 = (this->vnodes_rot).
           super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->vnodes_rot).
      super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar3) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      (*(psVar3[uVar4].
         super___shared_ptr<chrono::fea::ChContactNodeXYZROTsphere,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->collision_model->_vptr_ChCollisionModel[0x18])();
      psVar3 = (this->vnodes_rot).
               super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar1 = uVar5 < (ulong)((long)(this->vnodes_rot).
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4);
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar1);
  }
  return;
}

Assistant:

void ChContactSurfaceNodeCloud::SurfaceSyncCollisionModels() {
    for (unsigned int j = 0; j < vnodes.size(); j++) {
        this->vnodes[j]->GetCollisionModel()->SyncPosition();
    }
    for (unsigned int j = 0; j < vnodes_rot.size(); j++) {
        this->vnodes_rot[j]->GetCollisionModel()->SyncPosition();
    }
}